

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O1

bool __thiscall
tetgenmesh::fillcavity
          (tetgenmesh *this,arraypool *topshells,arraypool *botshells,arraypool *midfaces,
          arraypool *missingshs,arraypool *topnewtets,arraypool *botnewtets,triface *crossedge)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  tetrahedron P;
  point C;
  ulong uVar5;
  double *pb;
  double *pd;
  shellface ppdVar6;
  memorypool *pmVar7;
  undefined8 *puVar8;
  shellface *pppdVar9;
  int i;
  int iVar10;
  uint uVar11;
  long lVar12;
  char *pcVar13;
  unsigned_long uVar14;
  char *pcVar15;
  void *pvVar16;
  long lVar17;
  shellface ppdVar18;
  undefined4 *puVar19;
  long lVar20;
  long lVar21;
  int iVar22;
  arraypool *paVar23;
  uint uVar24;
  long lVar25;
  ulong uVar26;
  uint *puVar27;
  ulong uVar28;
  uint uVar29;
  point B;
  uint uVar30;
  ulong uVar31;
  uint uVar32;
  point A;
  long lVar33;
  long lVar34;
  ulong uVar35;
  ulong uVar36;
  long lVar37;
  bool bVar38;
  bool bVar39;
  double dVar40;
  face local_98;
  arraypool *local_88;
  arraypool *local_80;
  arraypool *local_78;
  arraypool *local_70;
  arraypool *local_68;
  long local_60;
  tetrahedron local_58;
  int types [2];
  int poss [4];
  
  local_70 = topshells;
  iVar10 = 0;
  do {
    paVar23 = botshells;
    if (iVar10 == 0) {
      paVar23 = topshells;
    }
    if ((paVar23 != (arraypool *)0x0) && (lVar21 = paVar23->objects, 0 < lVar21)) {
      lVar25 = 0;
      do {
        pcVar13 = paVar23->toparray[(uint)lVar25 >> ((byte)paVar23->log2objectsperblock & 0x1f)];
        lVar20 = (long)paVar23->objectbytes *
                 (long)(int)(paVar23->objectsperblockmark & (uint)lVar25);
        uVar26 = (*(ulong **)(pcVar13 + lVar20))[(ulong)(*(uint *)(pcVar13 + lVar20 + 8) & 1) + 9];
        uVar30 = (uint)uVar26 & 0xf;
        uVar26 = uVar26 & 0xfffffffffffffff0;
        if (uVar26 != 0) {
          uVar30 = stpivottbl[uVar30][(int)*(uint *)(pcVar13 + lVar20 + 8)];
        }
        uVar36 = **(ulong **)(pcVar13 + lVar20);
        uVar35 = uVar36 & 0xfffffffffffffff0;
        uVar11 = (uint)uVar36;
        uVar32 = uVar11 & 0xf;
        uVar36 = (ulong)(uVar32 * 4);
        lVar33 = *(long *)(uVar35 + (long)*(int *)((long)orgpivot + uVar36) * 8);
        lVar17 = *(long *)(uVar35 + (long)*(int *)((long)destpivot + uVar36) * 8);
        lVar34 = *(long *)(uVar35 + (long)*(int *)((long)apexpivot + uVar36) * 8);
        puVar27 = (uint *)(uVar26 + (long)this->elemmarkerindex * 4);
        *puVar27 = *puVar27 | 1;
        *(ulong *)(uVar35 + (ulong)(uVar11 & 3) * 8) =
             (long)*(int *)((long)bondtbl[0] + (long)(int)uVar30 * 4 + (ulong)(uVar32 * 0x30)) |
             uVar26;
        *(ulong *)(uVar26 + (ulong)(uVar30 & 3) * 8) = (long)bondtbl[(int)uVar30][uVar32] | uVar35;
        if (*(long *)(uVar26 + 0x48) != 0) {
          *(undefined8 *)(*(long *)(uVar26 + 0x48) + (ulong)(uVar30 & 3) * 8) = 0;
        }
        lVar12 = (long)this->point2simindex;
        *(ulong *)(lVar33 + lVar12 * 8) = uVar26;
        *(ulong *)(lVar17 + lVar12 * 8) = uVar26;
        *(ulong *)(lVar34 + lVar12 * 8) = uVar26;
        lVar25 = lVar25 + 1;
      } while (lVar21 != lVar25);
      local_70 = (arraypool *)(pcVar13 + lVar20);
    }
    bVar38 = iVar10 == 0;
    iVar10 = iVar10 + 1;
  } while (bVar38);
  local_68 = botshells;
  local_78 = topshells;
  if (crossedge == (triface *)0x0) {
    bVar38 = true;
  }
  else {
    local_88 = missingshs;
    local_80 = topnewtets;
    if (topnewtets->objects < 1) {
      uVar35 = 0;
      uVar36 = 0;
      uVar30 = 0;
      uVar26 = 0;
      bVar38 = false;
    }
    else {
      P = crossedge->tet[orgpivot[crossedge->ver]];
      local_58 = crossedge->tet[destpivot[crossedge->ver]];
      lVar21 = 0;
      bVar38 = false;
      uVar26 = 0;
      uVar30 = 0;
      uVar36 = 0;
      uVar35 = 0;
      do {
        local_60 = lVar21;
        if (!bVar38) {
          uVar28 = *(ulong *)(local_80->toparray
                              [(uint)lVar21 >> ((byte)local_80->log2objectsperblock & 0x1f)] +
                             (long)local_80->objectbytes *
                             (long)(int)(local_80->objectsperblockmark & (uint)lVar21));
          uVar31 = 0;
          do {
            A = *(point *)(uVar28 + (long)orgpivot[uVar31] * 8);
            lVar21 = (long)this->pointmarkindex;
            if (((((*(byte *)((long)A + lVar21 * 4 + 4) & 2) != 0) &&
                 (B = *(point *)(uVar28 + (long)destpivot[uVar31] * 8),
                 (*(byte *)((long)B + lVar21 * 4 + 4) & 2) != 0)) &&
                (C = *(point *)(uVar28 + (long)apexpivot[uVar31] * 8),
                (*(byte *)((long)C + lVar21 * 4 + 4) & 2) != 0)) &&
               (iVar10 = tri_edge_test(this,A,B,C,(point)P,(point)local_58,(point)0x0,1,types,poss),
               iVar10 == 2)) {
              dVar40 = orient3d(A,B,C,(double *)P);
              if (0.0 <= dVar40) {
                uVar35 = uVar31 & 0xffffffff;
                uVar36 = uVar28;
                if ((dVar40 == 0.0) && (!NAN(dVar40))) goto LAB_001375ef;
              }
              else {
                uVar35 = *(ulong *)(uVar28 + uVar31 * 8);
                uVar36 = uVar35 & 0xfffffffffffffff0;
                uVar35 = (ulong)fsymtbl[uVar31][(uint)uVar35 & 0xf];
                A = *(point *)(uVar36 + (long)orgpivot[uVar35] * 8);
                B = *(point *)(uVar36 + (long)destpivot[uVar35] * 8);
              }
              if (0 < botnewtets->objects) {
                lVar21 = 0;
                do {
                  uVar5 = *(ulong *)(botnewtets->toparray
                                     [(uint)lVar21 >> ((byte)botnewtets->log2objectsperblock & 0x1f)
                                     ] + (long)(int)((uint)lVar21 & botnewtets->objectsperblockmark)
                                         * (long)botnewtets->objectbytes);
                  if (*(point *)(uVar5 + 0x20) == B) {
                    uVar11 = 0xb;
LAB_00136808:
                    if (*(point *)(uVar5 + (long)destpivot[uVar11] * 8) != A) {
                      if (*(point *)(uVar5 + (long)apexpivot[uVar11] * 8) == A) {
                        puVar27 = (uint *)(eprevesymtbl + uVar11);
                      }
                      else {
                        if (*(point *)(uVar5 + (long)oppopivot[uVar11] * 8) != A) goto LAB_00136887;
                        puVar27 = (uint *)(enexttbl + esymtbl[uVar11]);
                      }
                      uVar11 = *puVar27;
                    }
                    if (*(point *)(uVar5 + (long)apexpivot[(int)uVar11] * 8) == C) {
                      bVar38 = true;
                      uVar26 = uVar5;
                      uVar30 = uVar11;
                      break;
                    }
                  }
                  else {
                    if (*(point *)(uVar5 + 0x28) == B) {
                      uVar11 = 3;
                      goto LAB_00136808;
                    }
                    if (*(point *)(uVar5 + 0x30) == B) {
                      uVar11 = 7;
                      goto LAB_00136808;
                    }
                    if (*(point *)(uVar5 + 0x38) == B) {
                      uVar11 = 0;
                      goto LAB_00136808;
                    }
                  }
LAB_00136887:
                  lVar21 = lVar21 + 1;
                } while (botnewtets->objects != lVar21);
              }
            }
          } while ((uVar31 < 3) && (uVar31 = uVar31 + 1, !bVar38));
        }
        lVar21 = local_60 + 1;
      } while ((lVar21 < local_80->objects) && (!bVar38));
    }
    paVar23 = local_88;
    uVar11 = (uint)uVar35;
    if (bVar38) {
      *(ulong *)(uVar36 + (ulong)(uVar11 & 3) * 8) =
           (long)bondtbl[(int)uVar11][(int)uVar30] | uVar26;
      *(ulong *)(uVar26 + (ulong)(uVar30 & 3) * 8) =
           (long)bondtbl[(int)uVar30][(int)uVar11] | uVar36;
      puVar27 = (uint *)(uVar36 + (long)this->elemmarkerindex * 4);
      *puVar27 = *puVar27 | 1;
      puVar27 = (uint *)(uVar26 + (long)this->elemmarkerindex * 4);
      *puVar27 = *puVar27 | 1;
      puVar27 = (uint *)(uVar36 + (long)this->elemmarkerindex * 4);
      *puVar27 = *puVar27 | 4 << (sbyte)(uVar11 & 3);
      pcVar13 = arraypool::getblock(midfaces,(int)midfaces->objects);
      lVar21 = (long)midfaces->objectbytes *
               ((long)midfaces->objectsperblock - 1U & midfaces->objects);
      midfaces->objects = midfaces->objects + 1;
      *(ulong *)(pcVar13 + lVar21) = uVar36;
      *(uint *)(pcVar13 + lVar21 + 8) = uVar11;
    }
    else {
      uVar14 = randomnation(this,(int)local_88->objects - 1);
      pcVar13 = paVar23->toparray[(int)(uint)uVar14 >> ((byte)paVar23->log2objectsperblock & 0x1f)];
      lVar21 = (long)paVar23->objectbytes * (long)(int)((uint)uVar14 & paVar23->objectsperblockmark)
      ;
      (this->recentsh).sh = *(shellface **)(pcVar13 + lVar21);
      (this->recentsh).shver = *(int *)(pcVar13 + lVar21 + 8);
      uVar36 = 0;
    }
    if ((bool)(0 < midfaces->objects & bVar38)) {
      lVar21 = 0;
      do {
        if (bVar38) {
          pcVar13 = midfaces->toparray[(uint)lVar21 >> ((byte)midfaces->log2objectsperblock & 0x1f)]
          ;
          lVar25 = (long)midfaces->objectbytes *
                   (long)(int)(midfaces->objectsperblockmark & (uint)lVar21);
          uVar11 = 0;
LAB_00136a78:
          uVar32 = *(uint *)(pcVar13 + lVar25 + 8);
          lVar20 = (long)this->pointmarkindex;
          uVar35 = (ulong)uVar32;
          uVar36 = *(ulong *)(pcVar13 + lVar25);
          do {
            uVar29 = esymtbl[(int)uVar35];
            uVar35 = (ulong)uVar29;
            pb = *(double **)(uVar36 + (long)apexpivot[(int)uVar29] * 8);
            if ((*(byte *)((long)pb + lVar20 * 4 + 4) & 2) != 0) {
              lVar33 = (long)this->elemmarkerindex;
              uVar2 = *(uint *)(uVar36 + lVar33 * 4);
              uVar24 = 4 << (sbyte)(uVar29 & 3);
              if ((uVar2 & uVar24) == 0) {
                uVar26 = *(ulong *)(*(ulong *)(pcVar13 + lVar25) + (ulong)(uVar32 & 3) * 8);
                uVar28 = uVar26 & 0xfffffffffffffff0;
                uVar30 = fsymtbl[(int)uVar32][(uint)uVar26 & 0xf];
                lVar17 = (long)(int)uVar30;
                uVar26 = uVar28;
                goto LAB_00136b67;
              }
              break;
            }
            if (pb == this->dummypoint) goto LAB_001375ef;
            uVar35 = *(ulong *)(uVar36 + (ulong)(uVar29 & 3) * 8);
            uVar36 = uVar35 & 0xfffffffffffffff0;
            uVar35 = (ulong)(uint)fsymtbl[(int)uVar29][(uint)uVar35 & 0xf];
          } while ((*(byte *)(uVar36 + (long)this->elemmarkerindex * 4) & 2) != 0);
          goto LAB_00136d22;
        }
LAB_00136d80:
        uVar11 = (uint)uVar35;
        lVar21 = lVar21 + 1;
      } while ((lVar21 < midfaces->objects) && (bVar38));
    }
    if (bVar38) {
      if (2 < this->b->verbose) {
        printf("      Found %ld middle subfaces.\n");
      }
      local_98.sh = (shellface *)0x0;
      local_98.shver = 0;
      lVar21 = midfaces->objects;
      if (0 < lVar21) {
        lVar25 = *(long *)*local_88->toparray;
        lVar20 = 0;
        do {
          pcVar13 = midfaces->toparray[(uint)lVar20 >> ((byte)midfaces->log2objectsperblock & 0x1f)]
          ;
          lVar33 = (long)midfaces->objectbytes *
                   (long)(int)(midfaces->objectsperblockmark & (uint)lVar20);
          puVar27 = (uint *)(*(long *)(pcVar13 + lVar33) + (long)this->elemmarkerindex * 4);
          *puVar27 = *puVar27 & ~(4 << (pcVar13[lVar33 + 8] & 3U));
          makeshellface(this,this->subfaces,&local_98);
          iVar3 = local_98.shver;
          pppdVar9 = local_98.sh;
          iVar10 = *(int *)(pcVar13 + lVar33 + 8);
          lVar21 = (long)local_98.shver;
          local_98.sh[sorgpivot[lVar21]] =
               *(shellface *)(*(long *)(pcVar13 + lVar33) + (long)orgpivot[iVar10] * 8);
          local_98.sh[sdestpivot[lVar21]] =
               *(shellface *)(*(long *)(pcVar13 + lVar33) + (long)destpivot[iVar10] * 8);
          local_98.sh[sapexpivot[lVar21]] =
               *(shellface *)(*(long *)(pcVar13 + lVar33) + (long)apexpivot[iVar10] * 8);
          *(undefined4 *)((long)local_98.sh + (long)this->shmarkindex * 4) =
               *(undefined4 *)(lVar25 + (long)this->shmarkindex * 4);
          if (this->checkconstraints != 0) {
            local_98.sh[this->areaboundindex] =
                 *(shellface *)(lVar25 + (long)this->areaboundindex * 8);
          }
          if (this->useinsertradius != 0) {
            *(undefined4 *)((long)local_98.sh + (long)this->shmarkindex * 4 + 8) =
                 *(undefined4 *)(lVar25 + 8 + (long)this->shmarkindex * 4);
          }
          if (*(long *)(*(long *)(pcVar13 + lVar33) + 0x48) == 0) {
            pvVar16 = memorypool::alloc(this->tet2subpool);
            *(void **)(*(long *)(pcVar13 + lVar33) + 0x48) = pvVar16;
            lVar17 = 0;
            do {
              *(undefined8 *)(*(long *)(*(long *)(pcVar13 + lVar33) + 0x48) + lVar17 * 8) = 0;
              lVar17 = lVar17 + 1;
            } while (lVar17 != 4);
          }
          uVar30 = *(uint *)(pcVar13 + lVar33 + 8);
          uVar26 = (ulong)((uVar30 & 3) << 3);
          *(ulong *)(*(long *)(*(long *)(pcVar13 + lVar33) + 0x48) + uVar26) =
               (long)tsbondtbl[(int)uVar30][lVar21] | (ulong)pppdVar9;
          pppdVar9[(ulong)(iVar3 & 1) + 9] =
               (shellface)((long)stbondtbl[(int)uVar30][lVar21] | *(ulong *)(pcVar13 + lVar33));
          uVar26 = *(ulong *)(*(long *)(pcVar13 + lVar33) + uVar26);
          uVar36 = uVar26 & 0xfffffffffffffff0;
          uVar30 = fsymtbl[(int)uVar30][(uint)uVar26 & 0xf];
          uVar11 = iVar3 ^ 1;
          local_98.shver = uVar11;
          if (*(long *)(uVar36 + 0x48) == 0) {
            pvVar16 = memorypool::alloc(this->tet2subpool);
            *(void **)(uVar36 + 0x48) = pvVar16;
            lVar21 = 0;
            do {
              *(undefined8 *)(*(long *)(uVar36 + 0x48) + lVar21 * 8) = 0;
              lVar21 = lVar21 + 1;
            } while (lVar21 != 4);
          }
          *(ulong *)(*(long *)(uVar36 + 0x48) + (ulong)(uVar30 & 3) * 8) =
               (long)tsbondtbl[(int)uVar30][(int)uVar11] | (ulong)pppdVar9;
          pppdVar9[(ulong)(uVar11 & 1) + 9] =
               (shellface)((long)stbondtbl[(int)uVar30][(int)uVar11] | uVar36);
          lVar20 = lVar20 + 1;
          lVar21 = midfaces->objects;
        } while (lVar20 < lVar21);
      }
      if (0 < lVar21) {
        iVar10 = midfaces->log2objectsperblock;
        uVar30 = midfaces->objectsperblockmark;
        iVar3 = midfaces->objectbytes;
        lVar25 = 0;
        uVar11 = 0;
LAB_001370a6:
        pcVar13 = midfaces->toparray[(uint)lVar25 >> ((byte)iVar10 & 0x1f)];
        lVar20 = (long)(int)((uint)lVar25 & uVar30) * (long)iVar3;
        iVar4 = this->shmarkindex;
        iVar22 = 0;
LAB_001370dc:
        uVar26 = *(ulong *)(pcVar13 + lVar20);
        if (*(long *)(uVar26 + 0x48) == 0) {
          local_98.sh = (shellface *)0x0;
        }
        else {
          uVar36 = *(ulong *)(*(long *)(uVar26 + 0x48) +
                             (ulong)(*(uint *)(pcVar13 + lVar20 + 8) & 3) * 8);
          local_98.sh = (shellface *)(uVar36 & 0xfffffffffffffff8);
          local_98.shver = tspivottbl[(int)*(uint *)(pcVar13 + lVar20 + 8)][(uint)uVar36 & 7];
        }
        if (local_98.sh[local_98.shver >> 1] < (shellface)0x8) {
          uVar32 = *(uint *)(pcVar13 + lVar20 + 8);
LAB_00137144:
          uVar26 = *(ulong *)(uVar26 + (long)facepivot1[(int)uVar32] * 8);
          uVar32 = facepivot2[(int)uVar32][(uint)uVar26 & 0xf];
          uVar26 = uVar26 & 0xfffffffffffffff0;
          if (*(long *)(uVar26 + 0x40) == 0) {
            ppdVar18 = (shellface)0x0;
          }
          else {
            ppdVar18 = (shellface)
                       (*(ulong *)(*(long *)(uVar26 + 0x40) + (long)ver2edge[(int)uVar32] * 8) &
                       0xfffffffffffffff8);
          }
          if (ppdVar18 == (shellface)0x0) goto code_r0x0013718f;
          uVar29 = (uint)*ppdVar18;
          uVar35 = (ulong)*ppdVar18 & 0xfffffffffffffff8;
          uVar36 = uVar26;
          if ((*(byte *)((long)ppdVar18 + (long)iVar4 * 4 + 4) & 1) != 0) {
            do {
              if (*(long *)(uVar36 + 0x40) != 0) {
                *(undefined8 *)(*(long *)(uVar36 + 0x40) + (long)ver2edge[(int)uVar32] * 8) = 0;
              }
              uVar28 = *(ulong *)(uVar36 + (long)facepivot1[(int)uVar32] * 8);
              uVar36 = uVar28 & 0xfffffffffffffff0;
              uVar32 = facepivot2[(int)uVar32][(uint)uVar28 & 0xf];
            } while (uVar36 != uVar26);
            pmVar7 = this->subsegs;
            ppdVar18[3] = (double *)0x0;
            *ppdVar18 = (double *)pmVar7->deaditemstack;
            pmVar7->deaditemstack = ppdVar18;
            pmVar7->items = pmVar7->items + -1;
            *(undefined8 *)(uVar35 + 0x30 + (ulong)(uVar29 & 6) * 4) = 0;
            ppdVar18 = (shellface)0x0;
          }
          ppdVar6 = *(shellface *)(uVar35 + (ulong)(uVar29 & 6) * 4);
          uVar26 = (ulong)ppdVar6 & 0xfffffffffffffff8;
          if (uVar26 != 0) {
            uVar32 = (uint)ppdVar6 & 7;
            if (ppdVar18 != (shellface)0x0) {
              local_98.shver =
                   local_98.shver ^
                   (uint)(local_98.sh[sorgpivot[local_98.shver]] !=
                         (shellface)ppdVar18[sorgpivot[0]]);
              uVar36 = *(ulong *)(uVar26 + (ulong)((uint)ppdVar6 & 6) * 4);
              while( true ) {
                uVar28 = uVar36 & 0xfffffffffffffff8;
                uVar11 = (uint)uVar36 & 7;
                if (uVar28 == uVar35) break;
                uVar36 = *(ulong *)(uVar28 + (ulong)(uVar11 >> 1) * 8);
                uVar26 = uVar28;
                uVar32 = uVar11;
              }
            }
            local_98.sh[local_98.shver >> 1] = ppdVar6;
            *(ulong *)(uVar26 + (ulong)(uVar32 >> 1) * 8) =
                 (long)local_98.shver | (ulong)local_98.sh;
          }
          if (ppdVar18 != (shellface)0x0) {
            local_98.sh[(long)(local_98.shver >> 1) + 6] = ppdVar18;
            *ppdVar18 = (double *)((long)local_98.shver | (ulong)local_98.sh);
          }
        }
        goto LAB_00137348;
      }
LAB_00137382:
      lVar21 = local_88->objects;
      if (0 < lVar21) {
        iVar10 = local_88->log2objectsperblock;
        uVar30 = local_88->objectsperblockmark;
        iVar3 = local_88->objectbytes;
        lVar25 = 0;
        do {
          pmVar7 = this->subfaces;
          puVar8 = *(undefined8 **)
                    (local_88->toparray[(uint)lVar25 >> ((byte)iVar10 & 0x1f)] +
                    (long)(int)((uint)lVar25 & uVar30) * (long)iVar3);
          puVar8[3] = 0;
          *puVar8 = pmVar7->deaditemstack;
          pmVar7->deaditemstack = puVar8;
          pmVar7->items = pmVar7->items + -1;
          lVar25 = lVar25 + 1;
        } while (lVar21 != lVar25);
      }
    }
    else if (uVar36 != 0) {
      lVar21 = local_88->objects;
      bVar39 = 1 < lVar21;
      if (1 < lVar21) {
        lVar25 = *(long *)(uVar36 + (long)orgpivot[(int)uVar11] * 8);
        lVar20 = *(long *)(uVar36 + (long)destpivot[(int)uVar11] * 8);
        lVar33 = *(long *)(uVar26 + (long)orgpivot[(int)uVar30] * 8);
        lVar17 = *(long *)(uVar26 + (long)destpivot[(int)uVar30] * 8);
        lVar34 = 1;
        do {
          pcVar13 = local_88->toparray[(uint)lVar34 >> ((byte)local_88->log2objectsperblock & 0x1f)]
          ;
          lVar37 = (long)(int)((uint)lVar34 & local_88->objectsperblockmark) *
                   (long)local_88->objectbytes;
          local_70 = (arraypool *)(pcVar13 + lVar37);
          lVar12 = *(long *)(pcVar13 + lVar37);
          iVar10 = *(int *)(pcVar13 + lVar37 + 8);
          lVar37 = *(long *)(lVar12 + (long)sorgpivot[iVar10] * 8);
          if (((((lVar37 == lVar25) && (*(long *)(lVar12 + (long)sdestpivot[iVar10] * 8) == lVar20))
               || ((lVar37 == lVar20 && (*(long *)(lVar12 + (long)sdestpivot[iVar10] * 8) == lVar25)
                   ))) ||
              ((lVar37 == lVar33 && (*(long *)(lVar12 + (long)sdestpivot[iVar10] * 8) == lVar17))))
             || ((lVar37 == lVar17 && (*(long *)(lVar12 + (long)sdestpivot[iVar10] * 8) == lVar33)))
             ) break;
          lVar34 = lVar34 + 1;
          bVar39 = lVar34 < lVar21;
        } while (lVar21 != lVar34);
      }
      if (!bVar39) {
LAB_001375ef:
        puVar19 = (undefined4 *)__cxa_allocate_exception(4);
        *puVar19 = 2;
        __cxa_throw(puVar19,&int::typeinfo,0);
      }
      (this->recentsh).sh = *(shellface **)local_70;
      (this->recentsh).shver = local_70->log2objectsperblock;
    }
    midfaces->objects = 0;
  }
  iVar10 = 0;
  do {
    paVar23 = local_68;
    if (iVar10 == 0) {
      paVar23 = local_78;
    }
    if ((paVar23 != (arraypool *)0x0) && (lVar21 = paVar23->objects, 0 < lVar21)) {
      iVar3 = paVar23->log2objectsperblock;
      uVar30 = paVar23->objectsperblockmark;
      iVar4 = paVar23->objectbytes;
      lVar25 = 0;
      do {
        pmVar7 = this->subfaces;
        puVar8 = *(undefined8 **)
                  (paVar23->toparray[(uint)lVar25 >> ((byte)iVar3 & 0x1f)] +
                  (long)(int)((uint)lVar25 & uVar30) * (long)iVar4);
        puVar8[3] = 0;
        *puVar8 = pmVar7->deaditemstack;
        pmVar7->deaditemstack = puVar8;
        pmVar7->items = pmVar7->items + -1;
        lVar25 = lVar25 + 1;
      } while (lVar21 != lVar25);
    }
    bVar39 = iVar10 == 0;
    iVar10 = iVar10 + 1;
  } while (bVar39);
  local_78->objects = 0;
  if (local_68 != (arraypool *)0x0) {
    local_68->objects = 0;
  }
  return bVar38;
  while( true ) {
    uVar31 = *(ulong *)(uVar26 + (ulong)(uVar30 & 3) * 8);
    uVar26 = uVar31 & 0xfffffffffffffff0;
    uVar30 = fsymtbl[(int)uVar30][(uint)uVar31 & 0xf];
    if (uVar26 == uVar28) break;
LAB_00136b67:
    uVar30 = esymtbl[(int)uVar30];
    if (*(double **)(uVar26 + (long)apexpivot[(int)uVar30] * 8) == pb) goto LAB_00136bba;
  }
  bVar38 = false;
LAB_00136bba:
  if (bVar38) {
    if ((*(byte *)(uVar26 + lVar33 * 4) & 2) == 0) goto LAB_001375ef;
    *(ulong *)(uVar36 + (ulong)(uVar29 & 3) * 8) = (long)bondtbl[(int)uVar29][(int)uVar30] | uVar26;
    *(ulong *)(uVar26 + (ulong)(uVar30 & 3) * 8) = (long)bondtbl[(int)uVar30][(int)uVar29] | uVar36;
    *(uint *)(uVar36 + lVar33 * 4) = uVar2 | 1;
    puVar27 = (uint *)(uVar26 + (long)this->elemmarkerindex * 4);
    *puVar27 = *puVar27 | 1;
    puVar27 = (uint *)(uVar36 + (long)this->elemmarkerindex * 4);
    *puVar27 = *puVar27 | uVar24;
    pcVar15 = arraypool::getblock(midfaces,(int)midfaces->objects);
    lVar20 = (long)midfaces->objectbytes *
             ((long)midfaces->objectsperblock - 1U & midfaces->objects);
    midfaces->objects = midfaces->objects + 1;
    *(ulong *)(pcVar15 + lVar20) = uVar36;
    *(uint *)(pcVar15 + lVar20 + 8) = uVar29;
  }
  else {
    uVar30 = esymtbl[lVar17];
    lVar33 = (long)(int)uVar30;
    pd = *(double **)(uVar28 + (long)apexpivot[lVar33] * 8);
    bVar1 = *(byte *)((long)pd + lVar20 * 4 + 4);
    uVar26 = uVar28;
    while ((bVar1 & 2) == 0) {
      uVar35 = *(ulong *)(uVar26 + (ulong)(uVar30 & 3) * 8);
      uVar26 = uVar35 & 0xfffffffffffffff0;
      uVar30 = esymtbl[fsymtbl[lVar33][(uint)uVar35 & 0xf]];
      lVar33 = (long)(int)uVar30;
      pd = *(double **)(uVar26 + (long)apexpivot[lVar33] * 8);
      bVar1 = *(byte *)((long)pd + lVar20 * 4 + 4);
    }
    dVar40 = orient3d(*(double **)(uVar36 + (long)destpivot[(int)uVar29] * 8),pb,
                      *(double **)(uVar36 + (long)oppopivot[(int)uVar29] * 8),pd);
    if (0.0 <= dVar40) {
      if (dVar40 <= 0.0) goto LAB_001375ef;
      uVar35 = (ulong)(uint)eprevtbl[(int)uVar29];
      uVar30 = eprevtbl[lVar33];
    }
    else {
      uVar35 = (ulong)(uint)enexttbl[(int)uVar29];
      uVar30 = enexttbl[lVar33];
    }
  }
LAB_00136d22:
  *(int *)(pcVar13 + lVar25 + 8) = enexttbl[*(int *)(pcVar13 + lVar25 + 8)];
  if ((1 < uVar11) || (uVar11 = uVar11 + 1, !bVar38)) goto LAB_00136d80;
  goto LAB_00136a78;
code_r0x0013718f:
  if (*(long *)(uVar26 + 0x48) == 0) {
    uVar36 = 0;
  }
  else {
    uVar35 = *(ulong *)(*(long *)(uVar26 + 0x48) + (ulong)(uVar32 & 3) * 8);
    uVar36 = uVar35 & 0xfffffffffffffff8;
    uVar11 = tspivottbl[(int)uVar32][(uint)uVar35 & 7];
  }
  if (uVar36 != 0) goto code_r0x001371cb;
  goto LAB_00137144;
code_r0x001371cb:
  local_98.sh[local_98.shver >> 1] = (shellface)(uVar36 | (long)(int)uVar11);
  *(ulong *)(uVar36 + (long)((int)uVar11 >> 1) * 8) = (long)local_98.shver | (ulong)local_98.sh;
LAB_00137348:
  *(int *)(pcVar13 + lVar20 + 8) = enexttbl[*(int *)(pcVar13 + lVar20 + 8)];
  iVar22 = iVar22 + 1;
  if (iVar22 == 3) goto code_r0x00137367;
  goto LAB_001370dc;
code_r0x00137367:
  lVar25 = lVar25 + 1;
  if (lVar25 == lVar21) goto LAB_00137382;
  goto LAB_001370a6;
}

Assistant:

bool tetgenmesh::fillcavity(arraypool* topshells, arraypool* botshells,
                            arraypool* midfaces, arraypool* missingshs,
                            arraypool* topnewtets, arraypool* botnewtets,
                            triface* crossedge)
{
  arraypool *cavshells;
  triface bdrytet, neightet, *parytet;
  triface searchtet, spintet;
  face *parysh;
  face checkseg;
  point pa, pb, pc;
  bool mflag;
  int t1ver;
  int i, j;

  // Connect newtets to tets outside the cavity.  These connections are needed
  //   for identifying the middle faces (which belong to R).
  for (j = 0; j < 2; j++) {
    cavshells = (j == 0 ? topshells : botshells);
    if (cavshells != NULL) {
      for (i = 0; i < cavshells->objects; i++) {
        // Get a temp subface.
        parysh = (face *) fastlookup(cavshells, i);
        // Get the boundary tet outside the cavity (saved in sh[0]).
        decode(parysh->sh[0], bdrytet);
        pa = org(bdrytet);
        pb = dest(bdrytet);
        pc = apex(bdrytet);
        // Get the adjacent new tet inside the cavity.
        stpivot(*parysh, neightet);
        // Mark neightet as an interior tet of this cavity.
        infect(neightet);
        // Connect the two tets (the old connections are replaced).
        bond(bdrytet, neightet); 
        tsdissolve(neightet); // Clear the pointer to tmpsh.
        // Update the point-to-tets map.
        setpoint2tet(pa, (tetrahedron) neightet.tet);
        setpoint2tet(pb, (tetrahedron) neightet.tet);
        setpoint2tet(pc, (tetrahedron) neightet.tet);
      } // i
    } // if (cavshells != NULL)
  } // j

  if (crossedge != NULL) {
    // Glue top and bottom tets at their common facet.
    triface toptet, bottet, spintet, *midface;
    point pd, pe;
    REAL ori;
    int types[2], poss[4];
    int interflag;
    int bflag;

    mflag = false;
    pd = org(*crossedge);
    pe = dest(*crossedge);

    // Search the first (middle) face in R. 
    // Since R may be non-convex, we must make sure that the face is in the
    //   interior of R.  We search a face in 'topnewtets' whose three vertices
    //   are on R and it intersects 'crossedge' in its interior. Then search
    //   a matching face in 'botnewtets'.
    for (i = 0; i < topnewtets->objects && !mflag; i++) {
      searchtet = * (triface *) fastlookup(topnewtets, i);
      for (searchtet.ver = 0; searchtet.ver < 4 && !mflag; searchtet.ver++) {
        pa = org(searchtet);
        if (pmarktested(pa)) {
          pb = dest(searchtet);
          if (pmarktested(pb)) {
            pc = apex(searchtet);
            if (pmarktested(pc)) {
              // Check if this face intersects [d,e].
              interflag = tri_edge_test(pa,pb,pc,pd,pe,NULL,1,types,poss);
              if (interflag == 2) {
                // They intersect at a single point. Found.
                toptet = searchtet;
                // The face lies in the interior of R.
                // Get the tet (in topnewtets) which lies above R.
                ori = orient3d(pa, pb, pc, pd);
                if (ori < 0) {
                  fsymself(toptet);
                  pa = org(toptet);
                  pb = dest(toptet);
                } else if (ori == 0) {
                  terminatetetgen(this, 2);
                }
                // Search the face [b,a,c] in 'botnewtets'.
                for (j = 0; j < botnewtets->objects; j++) {
                  neightet = * (triface *) fastlookup(botnewtets, j);                  
                  // Is neightet contains 'b'.
                  if ((point) neightet.tet[4] == pb) {
                    neightet.ver = 11;
                  } else if ((point) neightet.tet[5] == pb) {
                    neightet.ver = 3;
                  } else if ((point) neightet.tet[6] == pb) {
                    neightet.ver = 7;
                  } else if ((point) neightet.tet[7] == pb) {
                    neightet.ver = 0;
                  } else {
                    continue;
                  }
                  // Is the 'neightet' contains edge [b,a].
                  if (dest(neightet) == pa) {
                    // 'neightet' is just the edge.
                  } else if (apex(neightet) == pa) {
                    eprevesymself(neightet);
                  } else if (oppo(neightet) == pa) {
                    esymself(neightet);
                    enextself(neightet);
                  } else {
                    continue;
                  }
                  // Is 'neightet' the face [b,a,c]. 
                  if (apex(neightet) == pc) {
                    bottet = neightet;
                    mflag = true;
                    break;
                  }
                } // j
              } // if (interflag == 2)
            } // pc
          } // pb
        } // pa
      } // toptet.ver
    } // i

    if (mflag) {
      // Found a pair of matched faces in 'toptet' and 'bottet'.
      bond(toptet, bottet);
      // Both are interior tets.
      infect(toptet);
      infect(bottet);
      // Add this face into search list.
      markface(toptet);
      midfaces->newindex((void **) &parytet);
      *parytet = toptet;
    } else {
      // No pair of 'toptet' and 'bottet'.
      toptet.tet = NULL;
      // Randomly split an interior edge of R.
      i = randomnation(missingshs->objects - 1);
      recentsh = * (face *) fastlookup(missingshs, i);
    }

    // Find other middle faces, connect top and bottom tets.
    for (i = 0; i < midfaces->objects && mflag; i++) {
      // Get a matched middle face [a, b, c]
      midface = (triface *) fastlookup(midfaces, i);
      // Check the neighbors at the edges of this face. 
      for (j = 0; j < 3 && mflag; j++) {
        toptet = *midface;
        bflag = false;
        while (1) {
          // Go to the next face in the same tet.
          esymself(toptet);
          pc = apex(toptet);
          if (pmarktested(pc)) {
            break; // Find a subface.
          }
          if (pc == dummypoint) {
            terminatetetgen(this, 2); // Check this case.
            break; // Find a subface.
          }
          // Go to the adjacent tet.
          fsymself(toptet);
          // Do we walk outside the cavity? 
          if (!marktested(toptet)) {
            // Yes, the adjacent face is not a middle face.
            bflag = true; break; 
          }
        }
        if (!bflag) {
          if (!facemarked(toptet)) {
            fsym(*midface, bottet);
            spintet = bottet;
            while (1) {
              esymself(bottet);
              pd = apex(bottet);
              if (pd == pc) break; // Face matched.
              fsymself(bottet);
              if (bottet.tet == spintet.tet) {
                // Not found a matched bottom face.
                mflag = false;
                break;
              }
            } // while (1)
            if (mflag) {
              if (marktested(bottet)) {
                // Connect two tets together.
                bond(toptet, bottet);
                // Both are interior tets.
                infect(toptet);
                infect(bottet);
                // Add this face into list.
                markface(toptet);
                midfaces->newindex((void **) &parytet);
                *parytet = toptet;
              }
              else {
                // The 'bottet' is not inside the cavity! 
                terminatetetgen(this, 2); // Check this case
              }
            } else { // mflag == false
              // Adjust 'toptet' and 'bottet' to be the crossing edges.
              fsym(*midface, bottet);
              spintet = bottet;
              while (1) {
                esymself(bottet);
                pd = apex(bottet);
                if (pmarktested(pd)) {
                  // assert(pd != pc);
                  // Let 'toptet' be [a,b,c,#], and 'bottet' be [b,a,d,*].
                  // Adjust 'toptet' and 'bottet' to be the crossing edges.
                  // Test orient3d(b,c,#,d).
                  ori = orient3d(dest(toptet), pc, oppo(toptet), pd);
                  if (ori < 0) {
                    // Edges [a,d] and [b,c] cross each other.
                    enextself(toptet); // [b,c]
                    enextself(bottet); // [a,d]
                  } else if (ori > 0) {
                    // Edges [a,c] and [b,d] cross each other. 
                    eprevself(toptet); // [c,a]
                    eprevself(bottet); // [d,b]
                  } else {
                    // b,c,#,and d are coplanar!.
                    terminatetetgen(this, 2); //assert(0);
                  }
                  break; // Not matched
                }
                fsymself(bottet);
              }
            } // if (!mflag)
          } // if (!facemarked(toptet))
        } // if (!bflag)
        enextself(*midface);
      } // j
    } // i

    if (mflag) {
      if (b->verbose > 2) {
        printf("      Found %ld middle subfaces.\n", midfaces->objects);
      }
      face oldsh, newsh, casout, casin, neighsh;

      oldsh = * (face *) fastlookup(missingshs, 0);

      // Create new subfaces to fill the region R.
      for (i = 0; i < midfaces->objects; i++) {
        // Get a matched middle face [a, b, c]
        midface = (triface *) fastlookup(midfaces, i);
        unmarkface(*midface);
        makeshellface(subfaces, &newsh);
        setsorg(newsh, org(*midface));
        setsdest(newsh, dest(*midface));
        setsapex(newsh, apex(*midface));
        // The new subface gets its markers from the old one.
        setshellmark(newsh, shellmark(oldsh));
        if (checkconstraints) {
          setareabound(newsh, areabound(oldsh));
        }
        if (useinsertradius) {
          setfacetindex(newsh, getfacetindex(oldsh));
        }
        // Connect the new subface to adjacent tets.
        tsbond(*midface, newsh);
        fsym(*midface, neightet);
        sesymself(newsh);
        tsbond(neightet, newsh);
      }

      // Connect new subfaces together and to the bdry of R.
      // Delete faked segments.
      for (i = 0; i < midfaces->objects; i++) {
        // Get a matched middle face [a, b, c]
        midface = (triface *) fastlookup(midfaces, i);
        for (j = 0; j < 3; j++) {
          tspivot(*midface, newsh);
          spivot(newsh, casout);
          if (casout.sh == NULL) {
            // Search its neighbor.
            fnext(*midface, searchtet);
            while (1) {
              // (1) First check if this side is a bdry edge of R.
              tsspivot1(searchtet, checkseg);
              if (checkseg.sh != NULL) {
                // It's a bdry edge of R.
                // Get the old subface.
                checkseg.shver = 0;
                spivot(checkseg, oldsh);
                if (sinfected(checkseg)) {
                  // It's a faked segment. Delete it.
                  spintet = searchtet;
                  while (1) {
                    tssdissolve1(spintet);
                    fnextself(spintet);
                    if (spintet.tet == searchtet.tet) break;
                  }
                  shellfacedealloc(subsegs, checkseg.sh);
                  ssdissolve(oldsh);
                  checkseg.sh = NULL;
                }
                spivot(oldsh, casout);
                if (casout.sh != NULL) {
                  casin = casout;
                  if (checkseg.sh != NULL) {
                    // Make sure that the subface has the right ori at the 
                    //   segment.
                    checkseg.shver = 0;
                    if (sorg(newsh) != sorg(checkseg)) {
                      sesymself(newsh);
                    }
                    spivot(casin, neighsh);
                    while (neighsh.sh != oldsh.sh) {
                      casin = neighsh;
                      spivot(casin, neighsh);
                    }
                  }
                  sbond1(newsh, casout);
                  sbond1(casin, newsh);
                }
                if (checkseg.sh != NULL) {
                  ssbond(newsh, checkseg);
                }
                break;
              } // if (checkseg.sh != NULL)
              // (2) Second check if this side is an interior edge of R.
              tspivot(searchtet, neighsh);
              if (neighsh.sh != NULL) {
                // Found an adjacent subface of newsh (an interior edge).
                sbond(newsh, neighsh);
                break;
              }
              fnextself(searchtet);
            } // while (1)
          } // if (casout.sh == NULL)
          enextself(*midface);
        } // j
      } // i

      // Delete old subfaces.
      for (i = 0; i < missingshs->objects; i++) {
        parysh = (face *) fastlookup(missingshs, i);
        shellfacedealloc(subfaces, parysh->sh);
      }
    } else {
      if (toptet.tet != NULL) {
        // Faces at top and bottom are not matched. 
        // Choose a Steiner point in R.
        // Split one of the crossing edges.
        pa = org(toptet);
        pb = dest(toptet);
        pc = org(bottet);
        pd = dest(bottet);
        // Search an edge in R which is either [a,b] or [c,d].
        // Reminder:  Subfaces in this list 'missingshs', except the first
        //   one, represents an interior edge of R. 
        for (i = 1; i < missingshs->objects; i++) {
          parysh = (face *) fastlookup(missingshs, i);
          if (((sorg(*parysh) == pa) && (sdest(*parysh) == pb)) ||
              ((sorg(*parysh) == pb) && (sdest(*parysh) == pa))) break;
          if (((sorg(*parysh) == pc) && (sdest(*parysh) == pd)) ||
              ((sorg(*parysh) == pd) && (sdest(*parysh) == pc))) break;
        }
        if (i < missingshs->objects) {
          // Found. Return it.
          recentsh = *parysh;
        } else {
          terminatetetgen(this, 2); //assert(0);
        }
      }
    }

    midfaces->restart();
  } else {
    mflag = true;
  } 

  // Delete the temp subfaces.
  for (j = 0; j < 2; j++) {
    cavshells = (j == 0 ? topshells : botshells);
    if (cavshells != NULL) {
      for (i = 0; i < cavshells->objects; i++) {
        parysh = (face *) fastlookup(cavshells, i);
        shellfacedealloc(subfaces, parysh->sh);
      }
    }
  }

  topshells->restart();
  if (botshells != NULL) {
    botshells->restart();
  }

  return mflag;
}